

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O3

void RigidBodyDynamics::Math::SparseSolveLx(Model *model,MatrixNd *L,VectorNd *x)

{
  pointer puVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  
  if (model->qdot_size != 0) {
    puVar1 = (model->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar3 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar4 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    uVar6 = model->qdot_size + 1;
    uVar5 = 2;
    if (2 < uVar6) {
      uVar5 = (ulong)uVar6;
    }
    uVar7 = 1;
    do {
      uVar6 = puVar1[uVar7];
      if (uVar6 == 0) {
        dVar8 = pdVar2[uVar7 - 1];
      }
      else {
        dVar8 = pdVar2[uVar7 - 1];
        do {
          dVar8 = dVar8 - pdVar3[(uVar7 - 1) + lVar4 * (ulong)(uVar6 - 1)] * pdVar2[uVar6 - 1];
          pdVar2[uVar7 - 1] = dVar8;
          uVar6 = puVar1[uVar6];
        } while (uVar6 != 0);
      }
      pdVar2[uVar7 - 1] = dVar8 / pdVar3[(uVar7 - 1) * lVar4 + (uVar7 - 1)];
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar5);
  }
  return;
}

Assistant:

RBDL_DLLAPI void SparseSolveLx (Model &model, Math::MatrixNd &L, Math::VectorNd &x) {
  for (unsigned int i = 1; i <= model.qdot_size; i++) {
    unsigned int j = model.lambda_q[i];
    while (j != 0) {
      x[i - 1] = x[i - 1] - L(i - 1,j - 1) * x[j - 1];
      j = model.lambda_q[j];
    }
    x[i - 1] = x[i - 1] / L(i - 1,i - 1);
  }
}